

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_define_foreign_param_aux
               (sexp ctx,sexp env,char *name,int num_args,char *fname,sexp_proc1 f,char *param)

{
  sexp psVar1;
  sexp_gc_var_t local_48;
  sexp tmp;
  
  local_48.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  tmp = sexp_intern(ctx,param,-1);
  psVar1 = (sexp)&DAT_0000003e;
  tmp = sexp_env_ref(ctx,env,tmp,(sexp)&DAT_0000003e);
  if (((ulong)tmp & 3) == 0) {
    if (tmp->tag == 0x1b) {
      psVar1 = sexp_define_foreign_aux(ctx,env,name,num_args,3,fname,f,tmp);
    }
  }
  (ctx->value).context.saves = local_48.next;
  return psVar1;
}

Assistant:

sexp sexp_define_foreign_param_aux (sexp ctx, sexp env, const char *name,
                                    int num_args, const char *fname, sexp_proc1 f, const char *param) {
  sexp res = SEXP_FALSE;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_intern(ctx, param, -1);
  tmp = sexp_env_ref(ctx, env, tmp, SEXP_FALSE);
  if (sexp_opcodep(tmp))
    res = sexp_define_foreign_aux(ctx, env, name, num_args, 3, fname, f, tmp);
  sexp_gc_release1(ctx);
  return res;
}